

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::anon_unknown_30::AsyncStreamFd::tryReadInternal
          (AsyncStreamFd *this,void *buffer,size_t minBytes,size_t maxBytes,size_t alreadyRead)

{
  int osErrorNumber;
  PromiseNode *pPVar1;
  TransformPromiseNodeBase *pTVar2;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  _func_int **in_R9;
  bool bVar3;
  Promise<unsigned_long> PVar4;
  Own<kj::_::PromiseNode> local_78;
  Own<kj::_::PromiseNode> local_68;
  Disposer *local_58;
  Own<kj::_::PromiseNode> local_50;
  Own<kj::_::PromiseNode> local_40;
  
  local_58 = (Disposer *)((long)buffer + 0x20);
  do {
    while( true ) {
      pPVar1 = (PromiseNode *)read(*(int *)((long)buffer + 0x10),(void *)minBytes,alreadyRead);
      if (-1 < (long)pPVar1) break;
      osErrorNumber = kj::_::Debug::getOsErrorNumber(true);
      if (osErrorNumber != -1) {
        if (osErrorNumber != 0) {
          kj::_::Debug::Fault::Fault
                    ((Fault *)&local_68,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                     ,0x139,osErrorNumber,"n = ::read(fd, buffer, maxBytes)","");
          kj::_::Debug::Fault::~Fault((Fault *)&local_68);
          goto LAB_004989fe;
        }
        UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)&local_78);
        pTVar2 = (TransformPromiseNodeBase *)operator_new(0x50);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (pTVar2,&local_78,
                   kj::_::
                   TransformPromiseNode<kj::Promise<unsigned_long>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++:329:50),_kj::_::PropagateException>
                   ::anon_class_40_5_00d635ec_for_func::operator());
        (pTVar2->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0067bd68;
        pTVar2[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)buffer;
        pTVar2[1].dependency.disposer = (Disposer *)minBytes;
        pTVar2[1].dependency.ptr = (PromiseNode *)maxBytes;
        pTVar2[1].continuationTracePtr = (void *)alreadyRead;
        pTVar2[2].super_PromiseNode._vptr_PromiseNode = in_R9;
        local_68.disposer =
             (Disposer *)
             &kj::_::
              HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,kj::_::Void,kj::(anonymous_namespace)::AsyncStreamFd::tryReadInternal(void*,unsigned_long,unsigned_long,unsigned_long)::{lambda()#2},kj::_::PropagateException>>
              ::instance;
        local_68.ptr = (PromiseNode *)pTVar2;
        kj::_::maybeChain<unsigned_long>(&local_50,(Promise<unsigned_long> *)&local_68);
        pPVar1 = local_50.ptr;
        local_40.disposer = local_50.disposer;
        local_50.ptr = (PromiseNode *)0x0;
        Own<kj::_::PromiseNode>::dispose(&local_50);
        (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
        _vptr_AsyncInputStream = (_func_int **)local_50.disposer;
        (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
        _vptr_AsyncOutputStream = (_func_int **)pPVar1;
        local_40.ptr = (PromiseNode *)0x0;
        Own<kj::_::PromiseNode>::dispose(&local_40);
        Own<kj::_::PromiseNode>::dispose(&local_68);
        Own<kj::_::PromiseNode>::dispose(&local_78);
        pPVar1 = extraout_RDX_00;
        goto LAB_00498a03;
      }
    }
    if (pPVar1 == (PromiseNode *)0x0) goto LAB_004989fe;
    bVar3 = maxBytes < pPVar1;
    maxBytes = maxBytes - (long)pPVar1;
    if (bVar3 || (PromiseNode *)maxBytes == (PromiseNode *)0x0) {
      in_R9 = (_func_int **)((long)&pPVar1->_vptr_PromiseNode + (long)in_R9);
      goto LAB_004989fe;
    }
    minBytes = (long)&pPVar1->_vptr_PromiseNode + (long)&((Disposer *)minBytes)->_vptr_Disposer;
    alreadyRead = alreadyRead - (long)pPVar1;
    in_R9 = (_func_int **)((long)&pPVar1->_vptr_PromiseNode + (long)in_R9);
  } while (*(char *)((long)buffer + 0x70) != '\x01');
  if (*(char *)((long)buffer + 0x71) == '\x01') {
LAB_004989fe:
    Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,(FixVoid<unsigned_long>)in_R9);
    pPVar1 = extraout_RDX_01;
  }
  else {
    UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)&local_78);
    pTVar2 = (TransformPromiseNodeBase *)operator_new(0x50);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar2,&local_78,
               kj::_::
               TransformPromiseNode<kj::Promise<unsigned_long>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++:359:54),_kj::_::PropagateException>
               ::anon_class_40_5_00d635ec_for_func::operator());
    (pTVar2->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0067bdf0;
    pTVar2[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)buffer;
    pTVar2[1].dependency.disposer = (Disposer *)minBytes;
    pTVar2[1].dependency.ptr = (PromiseNode *)maxBytes;
    pTVar2[1].continuationTracePtr = (void *)alreadyRead;
    pTVar2[2].super_PromiseNode._vptr_PromiseNode = in_R9;
    local_68.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,kj::_::Void,kj::(anonymous_namespace)::AsyncStreamFd::tryReadInternal(void*,unsigned_long,unsigned_long,unsigned_long)::{lambda()#3},kj::_::PropagateException>>
          ::instance;
    local_68.ptr = (PromiseNode *)pTVar2;
    kj::_::maybeChain<unsigned_long>(&local_50,(Promise<unsigned_long> *)&local_68);
    pPVar1 = local_50.ptr;
    local_40.disposer = local_50.disposer;
    local_50.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_50);
    (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
    _vptr_AsyncInputStream = (_func_int **)local_50.disposer;
    (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
    _vptr_AsyncOutputStream = (_func_int **)pPVar1;
    local_40.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_40);
    Own<kj::_::PromiseNode>::dispose(&local_68);
    Own<kj::_::PromiseNode>::dispose(&local_78);
    pPVar1 = extraout_RDX;
  }
LAB_00498a03:
  PVar4.super_PromiseBase.node.ptr = pPVar1;
  PVar4.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar4.super_PromiseBase.node;
}

Assistant:

Promise<size_t> tryReadInternal(void* buffer, size_t minBytes, size_t maxBytes,
                                  size_t alreadyRead) {
    // `alreadyRead` is the number of bytes we have already received via previous reads -- minBytes,
    // maxBytes, and buffer have already been adjusted to account for them, but this count must
    // be included in the final return value.

    ssize_t n;
    KJ_NONBLOCKING_SYSCALL(n = ::read(fd, buffer, maxBytes)) {
      // Error.

      // We can't "return kj::READY_NOW;" inside this block because it causes a memory leak due to
      // a bug that exists in both Clang and GCC:
      //   http://gcc.gnu.org/bugzilla/show_bug.cgi?id=33799
      //   http://llvm.org/bugs/show_bug.cgi?id=12286
      goto error;
    }
    if (false) {
    error:
      return alreadyRead;
    }

    if (n < 0) {
      // Read would block.
      return observer.whenBecomesReadable().then([=]() {
        return tryReadInternal(buffer, minBytes, maxBytes, alreadyRead);
      });
    } else if (n == 0) {
      // EOF -OR- maxBytes == 0.
      return alreadyRead;
    } else if (implicitCast<size_t>(n) >= minBytes) {
      // We read enough to stop here.
      return alreadyRead + n;
    } else {
      // The kernel returned fewer bytes than we asked for (and fewer than we need).

      buffer = reinterpret_cast<byte*>(buffer) + n;
      minBytes -= n;
      maxBytes -= n;
      alreadyRead += n;

      KJ_IF_MAYBE(atEnd, observer.atEndHint()) {
        if (*atEnd) {
          // We've already received an indication that the next read() will return EOF, so there's
          // nothing to wait for.
          return alreadyRead;
        } else {
          // As of the last time the event queue was checked, the kernel reported that we were
          // *not* at the end of the stream. It's unlikely that this has changed in the short time
          // it took to handle the event, therefore calling read() now will almost certainly fail
          // with EAGAIN. Moreover, since EOF had not been received as of the last check, we know
          // that even if it was received since then, whenBecomesReadable() will catch that. So,
          // let's go ahead and skip calling read() here and instead go straight to waiting for
          // more input.
          return observer.whenBecomesReadable().then([=]() {
            return tryReadInternal(buffer, minBytes, maxBytes, alreadyRead);
          });
        }
      } else {
        // The kernel has not indicated one way or the other whether we are likely to be at EOF.
        // In this case we *must* keep calling read() until we either get a return of zero or
        // EAGAIN.
        return tryReadInternal(buffer, minBytes, maxBytes, alreadyRead);
      }
    }